

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleCase::verifyImage
          (TriangleCase *this,ConstPixelBufferAccess *testImageAccess,
          ConstPixelBufferAccess *referenceImageAccess)

{
  size_t sVar1;
  ConstPixelBufferAccess *ref;
  ConstPixelBufferAccess *test;
  MessageBuilder *pMVar2;
  TestLog *pTVar3;
  ConstPixelBufferAccess local_9e0;
  allocator<char> local_9b1;
  string local_9b0;
  allocator<char> local_989;
  string local_988;
  LogImage local_968;
  allocator<char> local_8d1;
  string local_8d0;
  allocator<char> local_8a9;
  string local_8a8;
  LogImage local_888;
  allocator<char> local_7f1;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  LogImage local_7a8;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  LogImageSet local_6c8;
  MessageBuilder local_688;
  PixelBufferAccess local_508;
  MessageBuilder local_4e0;
  MessageBuilder local_360;
  MessageBuilder local_1d0;
  int local_4c;
  undefined1 local_48 [4];
  int faultyPixels;
  Surface diffMask;
  TestLog *log;
  int faultyLimit;
  int kernelRadius;
  ConstPixelBufferAccess *referenceImageAccess_local;
  ConstPixelBufferAccess *testImageAccess_local;
  TriangleCase *this_local;
  
  log._4_4_ = 1;
  log._0_4_ = 6;
  _faultyLimit = referenceImageAccess;
  referenceImageAccess_local = testImageAccess;
  testImageAccess_local = (ConstPixelBufferAccess *)this;
  diffMask.m_pixels.m_cap =
       (size_t)tcu::TestContext::getLog
                         ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.
                          super_TestCase.super_TestNode.m_testCtx);
  tcu::Surface::Surface((Surface *)local_48,200,200);
  tcu::TestLog::operator<<
            (&local_1d0,(TestLog *)diffMask.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [21])"Comparing images... ");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  tcu::TestLog::operator<<
            (&local_360,(TestLog *)diffMask.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [28])"Deviation within radius of ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)((long)&log + 4));
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])0x2c1da6c);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_360);
  tcu::TestLog::operator<<
            (&local_4e0,(TestLog *)diffMask.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_4e0,(int *)&log);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [28])" faulty pixels are allowed.");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4e0);
  test = referenceImageAccess_local;
  ref = _faultyLimit;
  sVar1 = diffMask.m_pixels.m_cap;
  tcu::Surface::getAccess(&local_508,(Surface *)local_48);
  local_4c = compareBlackNonBlackImages((TestLog *)sVar1,test,ref,&local_508,1);
  sVar1 = diffMask.m_pixels.m_cap;
  if (6 < local_4c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"Images",&local_6e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_710,"Image comparison",&local_711);
    tcu::LogImageSet::LogImageSet(&local_6c8,&local_6e8,&local_710);
    pTVar3 = tcu::TestLog::operator<<((TestLog *)sVar1,&local_6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"TestImage",&local_7c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"Test image",&local_7f1)
    ;
    tcu::LogImage::LogImage
              (&local_7a8,&local_7c8,&local_7f0,referenceImageAccess_local,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_7a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a8,"ReferenceImage",&local_8a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d0,"Reference image",&local_8d1);
    tcu::LogImage::LogImage
              (&local_888,&local_8a8,&local_8d0,_faultyLimit,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_888);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_988,"DifferenceMask",&local_989);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b0,"Difference mask",&local_9b1);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_9e0,(Surface *)local_48);
    tcu::LogImage::LogImage
              (&local_968,&local_988,&local_9b0,&local_9e0,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_968);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::TestLog::operator<<(&local_688,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_688,(char (*) [5])0x2c0dbea);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_4c);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [18])" faulty pixel(s).");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_688);
    tcu::LogImage::~LogImage(&local_968);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::allocator<char>::~allocator(&local_9b1);
    std::__cxx11::string::~string((string *)&local_988);
    std::allocator<char>::~allocator(&local_989);
    tcu::LogImage::~LogImage(&local_888);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::allocator<char>::~allocator(&local_8d1);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::allocator<char>::~allocator(&local_8a9);
    tcu::LogImage::~LogImage(&local_7a8);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator(&local_7c9);
    tcu::LogImageSet::~LogImageSet(&local_6c8);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator(&local_711);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
    tcu::TestContext::setTestResult
              ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface((Surface *)local_48);
  return;
}

Assistant:

void TriangleCase::verifyImage (const tcu::ConstPixelBufferAccess& testImageAccess, const tcu::ConstPixelBufferAccess& referenceImageAccess)
{
	const int			kernelRadius	= 1;
	const int			faultyLimit		= 6;
	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	int					faultyPixels;

	log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
	log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;
	log << TestLog::Message << faultyLimit << " faulty pixels are allowed." << TestLog::EndMessage;

	faultyPixels = compareBlackNonBlackImages(log, testImageAccess, referenceImageAccess, diffMask.getAccess(), kernelRadius);

	if (faultyPixels > faultyLimit)
	{
		log << TestLog::ImageSet("Images", "Image comparison")
			<< TestLog::Image("TestImage", "Test image", testImageAccess)
			<< TestLog::Image("ReferenceImage", "Reference image", referenceImageAccess)
			<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
			<< TestLog::EndImageSet
			<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
	}
}